

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O0

int CVodeResizeHistory(void *cvode_mem,sunrealtype *t_hist,N_Vector *y_hist,N_Vector *f_hist,
                      int num_y_hist,int num_f_hist)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  N_Vector p_Var4;
  long lVar5;
  long in_RCX;
  undefined8 *in_RDX;
  sunrealtype *in_RSI;
  CVodeMem in_RDI;
  int in_R8D;
  int in_R9D;
  int i_4;
  int i_3;
  int i_2;
  int j_1;
  int wrk_space_size;
  N_Vector resize_wrk [13];
  SUNNonlinearSolver NLS;
  int j;
  int i_1;
  int i;
  int n_hist;
  CVodeMem cv_mem;
  int retval;
  int local_e4;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  long local_c8 [2];
  N_Vector *in_stack_ffffffffffffff48;
  sunrealtype in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  N_Vector *in_stack_ffffffffffffff60;
  N_Vector *in_stack_ffffffffffffff68;
  N_Vector in_stack_ffffffffffffff70;
  sunrealtype *in_stack_ffffffffffffff78;
  N_Vector *in_stack_ffffffffffffff88;
  sunrealtype in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  N_Vector *in_stack_ffffffffffffffa0;
  N_Vector in_stack_ffffffffffffffa8;
  int iVar6;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int iVar7;
  uint local_34;
  uint local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0xca,"CVodeResizeHistory",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = 0xffffffeb;
  }
  else if (in_RSI == (sunrealtype *)0x0) {
    cvProcessError(in_RDI,-0x16,0xd1,"CVodeResizeHistory",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                   ,"Time history array is NULL");
    local_4 = 0xffffffea;
  }
  else if (in_RDX == (undefined8 *)0x0) {
    cvProcessError(in_RDI,-0x16,0xd8,"CVodeResizeHistory",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                   ,"State history array is NULL");
    local_4 = 0xffffffea;
  }
  else if (in_RCX == 0) {
    cvProcessError(in_RDI,-0x16,0xdf,"CVodeResizeHistory",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                   ,"RHS history array is NULL");
    local_4 = 0xffffffea;
  }
  else {
    if (in_RDI->cv_q + 1 < in_RDI->cv_qmax) {
      iVar1 = in_RDI->cv_q + 1;
    }
    else {
      iVar1 = in_RDI->cv_qmax;
    }
    if (in_RDI->cv_lmm == 1) {
      if (in_R8D < 2) {
        cvProcessError(in_RDI,-0x16,0xeb,"CVodeResizeHistory",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                       ,"Insufficient solution history");
        return -0x16;
      }
      for (in_stack_ffffffffffffffb8 = 0; in_stack_ffffffffffffffb8 < iVar1;
          in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
        if (*(long *)(in_RCX + (long)in_stack_ffffffffffffffb8 * 8) == 0) {
          cvProcessError(in_RDI,-0x16,0xf4,"CVodeResizeHistory",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                         ,"Insufficient right-hand side history");
          return -0x16;
        }
      }
    }
    else {
      if (in_R9D < 2) {
        cvProcessError(in_RDI,-0x16,0xfe,"CVodeResizeHistory",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                       ,"Insufficient right-hand side history");
        return -0x16;
      }
      for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < iVar1;
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
        if (in_RDX[in_stack_ffffffffffffffb4] == 0) {
          cvProcessError(in_RDI,-0x16,0x107,"CVodeResizeHistory",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                         ,"Insufficient solution history");
          return -0x16;
        }
      }
    }
    iVar7 = iVar1;
    N_VDestroy(in_RDI->cv_ewt);
    p_Var4 = (N_Vector)N_VClone(*in_RDX);
    in_RDI->cv_ewt = p_Var4;
    if (in_RDI->cv_ewt == (N_Vector)0x0) {
      cvProcessError(in_RDI,-0x14,0x116,"CVodeResizeHistory",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                     ,"A vector allocation failed");
      local_4 = 0xffffffec;
    }
    else {
      N_VDestroy(in_RDI->cv_acor);
      p_Var4 = (N_Vector)N_VClone(*in_RDX);
      in_RDI->cv_acor = p_Var4;
      if (in_RDI->cv_acor == (N_Vector)0x0) {
        cvProcessError(in_RDI,-0x14,0x11f,"CVodeResizeHistory",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                       ,"A vector allocation failed");
        local_4 = 0xffffffec;
      }
      else {
        N_VDestroy(in_RDI->cv_tempv);
        p_Var4 = (N_Vector)N_VClone(*in_RDX);
        in_RDI->cv_tempv = p_Var4;
        if (in_RDI->cv_tempv == (N_Vector)0x0) {
          cvProcessError(in_RDI,-0x14,0x128,"CVodeResizeHistory",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                         ,"A vector allocation failed");
          local_4 = 0xffffffec;
        }
        else {
          N_VDestroy(in_RDI->cv_ftemp);
          p_Var4 = (N_Vector)N_VClone(*in_RDX);
          in_RDI->cv_ftemp = p_Var4;
          if (in_RDI->cv_ftemp == (N_Vector)0x0) {
            cvProcessError(in_RDI,-0x14,0x131,"CVodeResizeHistory",
                           "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                           ,"A vector allocation failed");
            local_4 = 0xffffffec;
          }
          else {
            N_VDestroy(in_RDI->cv_vtemp1);
            p_Var4 = (N_Vector)N_VClone(*in_RDX);
            in_RDI->cv_vtemp1 = p_Var4;
            if (in_RDI->cv_vtemp1 == (N_Vector)0x0) {
              cvProcessError(in_RDI,-0x14,0x13a,"CVodeResizeHistory",
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                             ,"A vector allocation failed");
              local_4 = 0xffffffec;
            }
            else {
              N_VDestroy(in_RDI->cv_vtemp2);
              p_Var4 = (N_Vector)N_VClone(*in_RDX);
              in_RDI->cv_vtemp2 = p_Var4;
              if (in_RDI->cv_vtemp2 == (N_Vector)0x0) {
                cvProcessError(in_RDI,-0x14,0x143,"CVodeResizeHistory",
                               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                               ,"A vector allocation failed");
                local_4 = 0xffffffec;
              }
              else {
                N_VDestroy(in_RDI->cv_vtemp3);
                p_Var4 = (N_Vector)N_VClone(*in_RDX);
                in_RDI->cv_vtemp3 = p_Var4;
                if (in_RDI->cv_vtemp3 == (N_Vector)0x0) {
                  cvProcessError(in_RDI,-0x14,0x14c,"CVodeResizeHistory",
                                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                                 ,"A vector allocation failed");
                  local_4 = 0xffffffec;
                }
                else {
                  if (in_RDI->cv_VabstolMallocDone != 0) {
                    N_VDestroy(in_RDI->cv_Vabstol);
                    p_Var4 = (N_Vector)N_VClone(*in_RDX);
                    in_RDI->cv_Vabstol = p_Var4;
                  }
                  if (in_RDI->cv_constraintsMallocDone != 0) {
                    N_VDestroy(in_RDI->cv_constraints);
                    in_RDI->cv_constraintsMallocDone = 0;
                    in_RDI->cv_constraintsSet = 0;
                  }
                  for (iVar6 = 0; iVar6 <= in_RDI->cv_qmax_alloc; iVar6 = iVar6 + 1) {
                    N_VDestroy(in_RDI->cv_zn[iVar6]);
                    p_Var4 = (N_Vector)N_VClone(*in_RDX);
                    in_RDI->cv_zn[iVar6] = p_Var4;
                    if (in_RDI->cv_zn[iVar6] == (N_Vector)0x0) {
                      cvProcessError(in_RDI,-0x14,0x166,"CVodeResizeHistory",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                                     ,"A vector allocation failed");
                      return -0x14;
                    }
                  }
                  if ((in_RDI->NLS != (SUNNonlinearSolver)0x0) && (in_RDI->ownNLS != 0)) {
                    iVar2 = SUNNonlinSolFree(in_RDI->NLS);
                    if (iVar2 != 0) {
                      cvProcessError(in_RDI,-0x14,0x175,"CVodeResizeHistory",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                                     ,"Destroying the Newton solver failed");
                      return -0x14;
                    }
                    in_RDI->NLS = (SUNNonlinearSolver)0x0;
                    in_RDI->ownNLS = 0;
                    in_stack_ffffffffffffffa8 =
                         (N_Vector)
                         SUNNonlinSol_Newton((N_Vector)
                                             CONCAT44(in_stack_ffffffffffffff34,
                                                      in_stack_ffffffffffffff30),
                                             (SUNContext_conflict)
                                             CONCAT44(in_stack_ffffffffffffff2c,
                                                      in_stack_ffffffffffffff28));
                    if (in_stack_ffffffffffffffa8 == (N_Vector)0x0) {
                      cvProcessError(in_RDI,-0x14,0x17f,"CVodeResizeHistory",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                                     ,"Error creating the Newton solver");
                      return -0x14;
                    }
                    iVar2 = CVodeSetNonlinearSolver
                                      ((void *)CONCAT44(in_stack_ffffffffffffff2c,
                                                        in_stack_ffffffffffffff28),
                                       (SUNNonlinearSolver)CONCAT44(in_stack_ffffffffffffff24,iVar1)
                                      );
                    if (iVar2 != 0) {
                      SUNNonlinSolFree(in_stack_ffffffffffffffa8);
                      cvProcessError(in_RDI,-0x14,0x188,"CVodeResizeHistory",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                                     ,"Error attaching default Newton solver");
                      return -0x14;
                    }
                    in_RDI->ownNLS = 1;
                  }
                  if (in_RDI->cv_qprime < in_RDI->cv_q) {
                    local_e4 = in_RDI->cv_q;
                  }
                  else {
                    local_e4 = in_RDI->cv_qprime;
                  }
                  if (in_RDI->cv_lmm == 2) {
                    local_e4 = local_e4 + 1;
                  }
                  for (iVar2 = 0; iVar2 < local_e4; iVar2 = iVar2 + 1) {
                    lVar5 = N_VClone(*in_RDX);
                    local_c8[iVar2] = lVar5;
                    if (local_c8[iVar2] == 0) {
                      for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
                        N_VDestroy(local_c8[iVar1]);
                      }
                      cvProcessError(in_RDI,-0x14,0x19e,"CVodeResizeHistory",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                                     ,"A vector allocation failed");
                      return -0x14;
                    }
                  }
                  if (in_RDI->cv_q < in_RDI->cv_qmax) {
                    if (in_RDI->cv_lmm == 1) {
                      local_34 = cvBuildNordsieckArrayAdams
                                           (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                            in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                            in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                                            in_stack_ffffffffffffff48);
                    }
                    else {
                      local_34 = cvBuildNordsieckArrayBDF
                                           ((sunrealtype *)CONCAT44(iVar7,in_stack_ffffffffffffffb8)
                                            ,(N_Vector *)CONCAT44(in_stack_ffffffffffffffb4,iVar6),
                                            in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
                                            in_stack_ffffffffffffff88);
                    }
                    if (local_34 != 0) {
                      cvProcessError(in_RDI,(int)(ulong)local_34,0x1bb,"CVodeResizeHistory",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                                     ,"Building the Nordsieck array failed");
                      return local_34;
                    }
                    uVar3 = cvPredictY(local_e4,(N_Vector *)
                                                CONCAT44(in_stack_ffffffffffffff2c,
                                                         in_stack_ffffffffffffff28),
                                       (N_Vector)CONCAT44(in_stack_ffffffffffffff24,iVar1));
                    if (uVar3 != 0) {
                      cvProcessError(in_RDI,(int)(ulong)uVar3,0x1c5,"CVodeResizeHistory",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                                     ,"Computing the predictor failed");
                      return uVar3;
                    }
                    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*in_RDX,in_RDI->cv_vtemp1,
                                 in_RDI->cv_zn[in_RDI->cv_qmax]);
                  }
                  if (in_RDI->cv_lmm == 1) {
                    local_34 = cvBuildNordsieckArrayAdams
                                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                          in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                          in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                                          in_stack_ffffffffffffff48);
                  }
                  else {
                    local_34 = cvBuildNordsieckArrayBDF
                                         ((sunrealtype *)CONCAT44(iVar7,in_stack_ffffffffffffffb8),
                                          (N_Vector *)CONCAT44(in_stack_ffffffffffffffb4,iVar6),
                                          in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
                                          in_stack_ffffffffffffff88);
                  }
                  if (local_34 == 0) {
                    in_RDI->cv_tn = *in_RSI;
                    for (iVar1 = 1; iVar1 < iVar7; iVar1 = iVar1 + 1) {
                      in_RDI->cv_tau[iVar1] = in_RSI[iVar1 + -1] - in_RSI[iVar1];
                    }
                    in_RDI->first_step_after_resize = 1;
                    for (iVar1 = 0; iVar1 < local_e4; iVar1 = iVar1 + 1) {
                      N_VDestroy(local_c8[iVar1]);
                    }
                    local_4 = 0;
                  }
                  else {
                    cvProcessError(in_RDI,(int)(ulong)local_34,0x1e2,"CVodeResizeHistory",
                                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                                   ,"Building the Nordsieck array failed");
                    local_4 = local_34;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int CVodeResizeHistory(void* cvode_mem, sunrealtype* t_hist, N_Vector* y_hist,
                       N_Vector* f_hist, int num_y_hist, int num_f_hist)
{
  int retval = 0;

  /* ------------ *
   * Check inputs *
   * ------------ */

  if (!cvode_mem)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return CV_MEM_NULL;
  }
  CVodeMem cv_mem = (CVodeMem)cvode_mem;

  if (!t_hist)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Time history array is NULL");
    return CV_ILL_INPUT;
  }

  if (!y_hist)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "State history array is NULL");
    return CV_ILL_INPUT;
  }

  if (!f_hist)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "RHS history array is NULL");
    return CV_ILL_INPUT;
  }

  /* Check that the input history is sufficient for the current (next) order */
  int n_hist = SUNMIN(cv_mem->cv_q + 1, cv_mem->cv_qmax);

  if (cv_mem->cv_lmm == CV_ADAMS)
  {
    if (num_y_hist < 2)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     "Insufficient solution history");
      return CV_ILL_INPUT;
    }

    for (int i = 0; i < n_hist; i++)
    {
      if (!f_hist[i])
      {
        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       "Insufficient right-hand side history");
        return CV_ILL_INPUT;
      }
    }
  }
  else
  {
    if (num_f_hist < 2)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     "Insufficient right-hand side history");
      return CV_ILL_INPUT;
    }

    for (int i = 0; i < n_hist; i++)
    {
      if (!y_hist[i])
      {
        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       "Insufficient solution history");
        return CV_ILL_INPUT;
      }
    }
  }

  /* -------------- *
   * Resize vectors *
   * -------------- */

  N_VDestroy(cv_mem->cv_ewt);
  cv_mem->cv_ewt = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_ewt))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_acor);
  cv_mem->cv_acor = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_acor))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_tempv);
  cv_mem->cv_tempv = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_tempv))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_ftemp);
  cv_mem->cv_ftemp = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_ftemp))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_vtemp1);
  cv_mem->cv_vtemp1 = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_vtemp1))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_vtemp2);
  cv_mem->cv_vtemp2 = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_vtemp2))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_vtemp3);
  cv_mem->cv_vtemp3 = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_vtemp3))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  /* User will need to set a new vector of absolute tolerances */
  if (cv_mem->cv_VabstolMallocDone)
  {
    N_VDestroy(cv_mem->cv_Vabstol);
    cv_mem->cv_Vabstol = N_VClone(y_hist[0]);
  }

  /* User will need to set a new constraints vector */
  if (cv_mem->cv_constraintsMallocDone)
  {
    N_VDestroy(cv_mem->cv_constraints);
    cv_mem->cv_constraintsMallocDone = SUNFALSE;
    cv_mem->cv_constraintsSet        = SUNFALSE;
  }

  for (int j = 0; j <= cv_mem->cv_qmax_alloc; j++)
  {
    N_VDestroy(cv_mem->cv_zn[j]);
    cv_mem->cv_zn[j] = N_VClone(y_hist[0]);
    if (!(cv_mem->cv_zn[j]))
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "A vector allocation failed");
      return CV_MEM_FAIL;
    }
  }

  /* ----------------------- *
   * Resize nonlinear solver *
   * ----------------------- */

  if (cv_mem->NLS && cv_mem->ownNLS)
  {
    retval = SUNNonlinSolFree(cv_mem->NLS);
    if (retval)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "Destroying the Newton solver failed");
      return CV_MEM_FAIL;
    }
    cv_mem->NLS    = NULL;
    cv_mem->ownNLS = SUNFALSE;

    SUNNonlinearSolver NLS = SUNNonlinSol_Newton(y_hist[0], cv_mem->cv_sunctx);
    if (!NLS)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "Error creating the Newton solver");
      return CV_MEM_FAIL;
    }

    retval = CVodeSetNonlinearSolver(cv_mem, NLS);
    if (retval)
    {
      SUNNonlinSolFree(NLS);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "Error attaching default Newton solver");
      return CV_MEM_FAIL;
    }
    cv_mem->ownNLS = SUNTRUE;
  }

  /* ----------------------------- *
   * Create workspace for resizing *
   * ----------------------------- */

  N_Vector resize_wrk[L_MAX];

  int wrk_space_size = SUNMAX(cv_mem->cv_q, cv_mem->cv_qprime);
  if (cv_mem->cv_lmm == CV_BDF) { wrk_space_size++; }

  for (int j = 0; j < wrk_space_size; j++)
  {
    resize_wrk[j] = N_VClone(y_hist[0]);
    if (!resize_wrk[j])
    {
      for (int i = 0; i < j; i++) { N_VDestroy(resize_wrk[i]); }
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "A vector allocation failed");
      return CV_MEM_FAIL;
    }
  }

  /* ------------------------------------------------------------------------ *
   * Construct Nordsieck array at the old time but with the new size to
   * compute correction vector at the new state size.
   * ------------------------------------------------------------------------ */

  if (cv_mem->cv_q < cv_mem->cv_qmax)
  {
    /* Compute z_{n-1} with new history size */
    if (cv_mem->cv_lmm == CV_ADAMS)
    {
      retval = cvBuildNordsieckArrayAdams(t_hist + 1, y_hist[1], f_hist + 1,
                                          resize_wrk, cv_mem->cv_q,
                                          cv_mem->cv_hscale, cv_mem->cv_zn);
    }
    else
    {
      retval = cvBuildNordsieckArrayBDF(t_hist + 1, y_hist + 1, f_hist[1],
                                        resize_wrk, cv_mem->cv_q,
                                        cv_mem->cv_hscale, cv_mem->cv_zn);
    }

    if (retval)
    {
      cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                     "Building the Nordsieck array failed");
      return retval;
    }

    /* Get predicted value */
    retval = cvPredictY(cv_mem->cv_q, cv_mem->cv_zn, cv_mem->cv_vtemp1);

    if (retval)
    {
      cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                     "Computing the predictor failed");
      return retval;
    }

    /* Resized correction */
    N_VLinearSum(ONE, y_hist[0], -ONE, cv_mem->cv_vtemp1,
                 cv_mem->cv_zn[cv_mem->cv_qmax]);
  }

  /* ----------------------------- *
   * Construct new Nordsieck Array *
   * ----------------------------- */

  if (cv_mem->cv_lmm == CV_ADAMS)
  {
    retval = cvBuildNordsieckArrayAdams(t_hist, y_hist[0], f_hist, resize_wrk,
                                        cv_mem->cv_qprime, cv_mem->cv_hscale,
                                        cv_mem->cv_zn);
  }
  else
  {
    retval = cvBuildNordsieckArrayBDF(t_hist, y_hist, f_hist[0], resize_wrk,
                                      cv_mem->cv_qprime, cv_mem->cv_hscale,
                                      cv_mem->cv_zn);
  }

  if (retval)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Building the Nordsieck array failed");
    return retval;
  }

  /* ------------------- *
   * Update time history *
   * ------------------- */

  /* Ensure internal time and step history match the input history */
  cv_mem->cv_tn = t_hist[0];

  for (int i = 1; i < n_hist; i++)
  {
    cv_mem->cv_tau[i] = t_hist[i - 1] - t_hist[i];
  }

  /* In the next step, perform initialization needed after a resize */
  cv_mem->first_step_after_resize = SUNTRUE;

  /* ------------------------------ *
   * Destroy workspace for resizing *
   * ------------------------------ */

  for (int i = 0; i < wrk_space_size; i++) { N_VDestroy(resize_wrk[i]); }

  return CV_SUCCESS;
}